

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeDoubleRegLoad(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  
  if ((Insn >> 0xc & 0xf) < 0xe) {
    Decoder_00 = GPRPairDecoderTable;
    MCOperand_CreateReg0
              (Inst,(uint)*(ushort *)((long)GPRPairDecoderTable + (ulong)(Insn >> 0xc & 0xe)));
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0x10 & 0xf]);
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,Decoder_00);
    DVar1 = (*(code *)(&DAT_0032067c + *(int *)(&DAT_0032067c + (ulong)DVar1 * 4)))();
    return DVar1;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeDoubleRegLoad(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRPairRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}